

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DeepScanLineOutputFile::initialize(DeepScanLineOutputFile *this,Header *header)

{
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  long lVar4;
  pointer ppLVar5;
  Format FVar6;
  int iVar7;
  Box2i *pBVar8;
  LineOrder *pLVar9;
  uint *puVar10;
  Compression *pCVar11;
  Compressor *pCVar12;
  LineBuffer *pLVar13;
  long *plVar14;
  void *pvVar15;
  Data *pDVar16;
  long lVar17;
  Data *this_00;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  
  Header::operator=(&this->_data->header,header);
  Header::setType(&this->_data->header,(string *)&DEEPSCANLINE_abi_cxx11_);
  pBVar8 = Header::dataWindow(header);
  pLVar9 = Header::lineOrder(header);
  iVar7 = (pBVar8->min).y;
  iVar1 = (pBVar8->max).y;
  iVar21 = iVar1;
  if (*pLVar9 == INCREASING_Y) {
    iVar21 = iVar7;
  }
  pDVar16 = this->_data;
  pDVar16->currentScanLine = iVar21;
  pDVar16->missingScanLines = (iVar1 - iVar7) + 1;
  pLVar9 = Header::lineOrder(header);
  pDVar16 = this->_data;
  pDVar16->lineOrder = *pLVar9;
  iVar7 = (pBVar8->min).y;
  iVar1 = (pBVar8->max).x;
  iVar21 = (pBVar8->max).y;
  pDVar16->minX = (pBVar8->min).x;
  pDVar16->maxX = iVar1;
  pDVar16->minY = iVar7;
  pDVar16->maxY = iVar21;
  iVar21 = iVar21 - iVar7;
  uVar20 = 0xffffffffffffffff;
  if (-2 < iVar21) {
    uVar20 = (long)iVar21 * 4 + 4;
  }
  puVar10 = (uint *)operator_new__(uVar20);
  puVar2 = (pDVar16->lineSampleCount)._data;
  this_00 = pDVar16;
  if (puVar2 != (uint *)0x0) {
    operator_delete__(puVar2);
    this_00 = this->_data;
  }
  (pDVar16->lineSampleCount)._size = (long)iVar21 + 1;
  (pDVar16->lineSampleCount)._data = puVar10;
  pCVar11 = Header::compression(&this_00->header);
  pCVar12 = newCompressor(*pCVar11,0,&this->_data->header);
  FVar6 = defaultFormat(pCVar12);
  this->_data->format = FVar6;
  iVar7 = numLinesInBuffer(pCVar12);
  pDVar16 = this->_data;
  pDVar16->linesInBuffer = iVar7;
  if (pCVar12 != (Compressor *)0x0) {
    (*pCVar12->_vptr_Compressor[1])(pCVar12);
    pDVar16 = this->_data;
    iVar7 = pDVar16->linesInBuffer;
  }
  iVar7 = ((pDVar16->maxY - pDVar16->minY) + iVar7) / iVar7;
  Header::setChunkCount(&pDVar16->header,iVar7);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->_data->lineOffsets,(long)iVar7);
  pDVar16 = this->_data;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&pDVar16->bytesPerLine,(long)((pDVar16->maxY - pDVar16->minY) + 1));
  pDVar16 = this->_data;
  iVar7 = (pDVar16->maxY - pDVar16->minY) + 1;
  if (pDVar16->linesInBuffer <= iVar7) {
    iVar7 = pDVar16->linesInBuffer;
  }
  pDVar16->maxSampleCountTableSize = (long)(((pDVar16->maxX - pDVar16->minX) + 1) * iVar7) << 2;
  if ((pDVar16->lineBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pDVar16->lineBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar20 = 0;
    do {
      pLVar13 = (LineBuffer *)operator_new(200);
      iVar7 = pDVar16->linesInBuffer;
      lVar17 = (long)iVar7;
      (pLVar13->exception).field_2._M_allocated_capacity = 0;
      (pLVar13->_sem)._semaphore.__align = 0;
      *(undefined2 *)((long)&(pLVar13->_sem)._semaphore + 8) = 0;
      (pLVar13->buffer)._size = 0;
      (pLVar13->buffer)._data = (char *)0x0;
      pLVar13->dataPtr = (char *)0x0;
      pLVar13->dataSize = 0;
      *(undefined4 *)&pLVar13->field_0x1c = 0;
      pLVar13->endOfLineBufferData = (char *)0x0;
      pLVar13->scanLineMin = 0;
      pLVar13->scanLineMax = 0;
      pLVar13->compressor = (Compressor *)0x0;
      pLVar13->partiallyFull = false;
      pLVar13->hasException = false;
      *(undefined6 *)&pLVar13->field_0x42 = 0;
      (pLVar13->exception)._M_dataplus = (pointer)0x0;
      *(LineBuffer **)((long)&(pLVar13->_sem)._semaphore + 0x10) = pLVar13 + 1;
      *(undefined8 *)((long)&(pLVar13->_sem)._semaphore + 0x18) = 0;
      *(undefined1 *)&pLVar13[1].buffer._size = 0;
      IlmThread_2_5::Semaphore::Semaphore((Semaphore *)&pLVar13[1].dataPtr,1);
      uVar18 = lVar17 * 0x10 + 8;
      if (iVar7 < 0) {
        uVar18 = 0xffffffffffffffff;
      }
      plVar14 = (long *)operator_new__(uVar18);
      *plVar14 = lVar17;
      if (iVar7 != 0) {
        memset(plVar14 + 1,0,lVar17 * 0x10);
      }
      pcVar3 = (pLVar13->buffer)._data;
      if (pcVar3 != (char *)0x0) {
        lVar4 = *(long *)(pcVar3 + -8);
        if (lVar4 != 0) {
          lVar19 = lVar4 << 4;
          do {
            pvVar15 = *(void **)(pcVar3 + -8 + lVar19);
            if (pvVar15 != (void *)0x0) {
              operator_delete__(pvVar15);
            }
            lVar19 = lVar19 + -0x10;
          } while (lVar19 != 0);
        }
        operator_delete__(pcVar3 + -8,lVar4 << 4 | 8);
      }
      (pLVar13->buffer)._size = lVar17;
      (pLVar13->buffer)._data = (char *)(plVar14 + 1);
      (this->_data->lineBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar20] = pLVar13;
      pDVar16 = this->_data;
      pCVar12 = (Compressor *)pDVar16->maxSampleCountTableSize;
      pLVar13 = (pDVar16->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar20];
      pvVar15 = operator_new__((ulong)pCVar12);
      if (*(void **)&pLVar13->partiallyFull != (void *)0x0) {
        operator_delete__(*(void **)&pLVar13->partiallyFull);
        pDVar16 = this->_data;
      }
      pLVar13->compressor = pCVar12;
      *(void **)&pLVar13->partiallyFull = pvVar15;
      pCVar11 = Header::compression(&pDVar16->header);
      pCVar12 = newCompressor(*pCVar11,this->_data->maxSampleCountTableSize,&this->_data->header);
      pDVar16 = this->_data;
      ppLVar5 = (pDVar16->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (ppLVar5[uVar20]->exception).field_2._M_allocated_capacity = (size_type)pCVar12;
      uVar20 = uVar20 + 1;
    } while (uVar20 < (ulong)((long)(pDVar16->lineBuffers).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar5 >> 3)
            );
  }
  return;
}

Assistant:

void
DeepScanLineOutputFile::initialize (const Header &header)
{
    _data->header = header;

    _data->header.setType(DEEPSCANLINE);
    
    const Box2i &dataWindow = header.dataWindow();

    _data->currentScanLine = (header.lineOrder() == INCREASING_Y)?
                                 dataWindow.min.y: dataWindow.max.y;

    _data->missingScanLines = dataWindow.max.y - dataWindow.min.y + 1;
    _data->lineOrder = header.lineOrder();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    _data->lineSampleCount.resizeErase(_data->maxY - _data->minY + 1);

    Compressor* compressor = newCompressor (_data->header.compression(),
                                            0,
                                            _data->header);
    _data->format = defaultFormat (compressor);
    _data->linesInBuffer = numLinesInBuffer (compressor);
    if (compressor != 0)
        delete compressor;

    int lineOffsetSize = (_data->maxY - _data->minY +
                          _data->linesInBuffer) / _data->linesInBuffer;


    _data->header.setChunkCount(lineOffsetSize);

    _data->lineOffsets.resize (lineOffsetSize);

    _data->bytesPerLine.resize (_data->maxY - _data->minY + 1);

    _data->maxSampleCountTableSize = min(_data->linesInBuffer, _data->maxY - _data->minY + 1) *
                                     (_data->maxX - _data->minX + 1) *
                                     sizeof(unsigned int);

    for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
    {
        _data->lineBuffers[i] = new LineBuffer (_data->linesInBuffer);
        _data->lineBuffers[i]->sampleCountTableBuffer.resizeErase(_data->maxSampleCountTableSize);

        _data->lineBuffers[i]->sampleCountTableCompressor =
        newCompressor (_data->header.compression(),
                               _data->maxSampleCountTableSize,
                               _data->header);
    }
}